

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64_test.c
# Opt level: O0

bool_t u64Test(void)

{
  bool_t bVar1;
  u64 uVar2;
  u64 *puVar3;
  size_t sVar4;
  octet b [16];
  u64 a [2];
  u64 w;
  void *in_stack_ffffffffffffffb8;
  u64 *in_stack_ffffffffffffffc0;
  u64 *dest;
  
  uVar2 = u64Rev(0x102030405060708);
  if ((uVar2 == 0x807060504030201) &&
     (uVar2 = u64Rev(0x807060504030201), uVar2 == 0x102030405060708)) {
    u64Rev2(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    u64Rev2(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    dest = (u64 *)0x807060504030201;
    puVar3 = (u64 *)u64Rev(0x102030405060708);
    if ((dest == puVar3) && (uVar2 = u64Bitrev(0x102030405060708), uVar2 == 0x10e060a020c04080)) {
      uVar2 = u64Bitrev(0x102030405060708);
      uVar2 = u64Bitrev(uVar2);
      if ((((((uVar2 == 0x102030405060708) && (sVar4 = u64Weight(0), sVar4 == 0)) &&
            (bVar1 = u64Parity(0), bVar1 == 0)) &&
           (((bVar1 = u64Parity(1), bVar1 != 0 && (sVar4 = u64Weight(0xa001), sVar4 == 3)) &&
            (bVar1 = u64Parity(0xa001), bVar1 != 0)))) &&
          (((sVar4 = u64Weight(0xffff), sVar4 == 0x10 && (bVar1 = u64Parity(0xffff), bVar1 == 0)) &&
           ((((sVar4 = u64Weight(0xf000a001), sVar4 == 7 &&
              (((bVar1 = u64Parity(0xf000a001), bVar1 != 0 &&
                (sVar4 = u64Weight(0xe00a001), sVar4 == 6)) &&
               (bVar1 = u64Parity(0xe00a001), bVar1 == 0)))) &&
             ((sVar4 = u64Weight(0xffffffff), sVar4 == 0x20 &&
              (bVar1 = u64Parity(0xffffffff), bVar1 == 0)))) &&
            (sVar4 = u64Weight(0xaa0180eef000a001), sVar4 == 0x13)))))) &&
         (((((((bVar1 = u64Parity(0xaa0180eef000a001), bVar1 != 0 &&
               (sVar4 = u64Weight(0x730085060e00a001), sVar4 == 0x10)) &&
              ((bVar1 = u64Parity(0x730085060e00a001), bVar1 == 0 &&
               ((((sVar4 = u64Weight(0xffffffffffffffff), sVar4 == 0x40 &&
                  (bVar1 = u64Parity(0xffffffffffffffff), bVar1 == 0)) &&
                 (sVar4 = u64CTZ(0x10749b), sVar4 == 0x40)) &&
                ((sVar4 = u64CTZ_fast(0), sVar4 == 0x40 && (sVar4 = u64CLZ(0x1074c1), sVar4 == 0x40)
                 ))))))) && (sVar4 = u64CLZ_fast(0), sVar4 == 0x40)) &&
            ((sVar4 = u64CTZ(0x1074e8), sVar4 == 0 && (sVar4 = u64CTZ_fast(1), sVar4 == 0)))) &&
           (((sVar4 = u64CLZ(0x107510), sVar4 == 0x3f &&
             (((sVar4 = u64CLZ_fast(1), sVar4 == 0x3f && (sVar4 = u64CTZ(0x107538), sVar4 == 3)) &&
              (sVar4 = u64CTZ_fast(0xfff8), sVar4 == 3)))) &&
            (((sVar4 = u64CLZ(0x107560), sVar4 == 0x30 &&
              (sVar4 = u64CLZ_fast(0xfff8), sVar4 == 0x30)) &&
             (sVar4 = u64CTZ(0x107588), sVar4 == 0xd)))))) &&
          (((((sVar4 = u64CTZ_fast(0x7fffe000), sVar4 == 0xd &&
              (sVar4 = u64CLZ(0x1075ac), sVar4 == 0x21)) &&
             ((sVar4 = u64CLZ_fast(0x7fffe000), sVar4 == 0x21 &&
              (((sVar4 = u64CTZ(0x1075d1), sVar4 == 0xf &&
                (sVar4 = u64CTZ_fast(0x3ffddf8000), sVar4 == 0xf)) &&
               (sVar4 = u64CLZ(0x1075fb), sVar4 == 0x1a)))))) &&
            ((sVar4 = u64CLZ_fast(0x3ffddf8000), sVar4 == 0x1a &&
             (uVar2 = u64Deshuffle(0), uVar2 == 0)))) &&
           ((uVar2 = u64Deshuffle(1), uVar2 == 1 &&
            ((uVar2 = u64Deshuffle(2), uVar2 == 0x100000000 &&
             (uVar2 = u64Deshuffle(0xaaaaaaaaaaaaaaaa), uVar2 == 0xffffffff00000000)))))))))) {
        uVar2 = u64Deshuffle(0xfedcba9876543210);
        uVar2 = u64Shuffle(uVar2);
        if (uVar2 == 0xfedcba9876543210) {
          uVar2 = u64Shuffle(0x9876543210fedcba);
          uVar2 = u64Deshuffle(uVar2);
          if ((((uVar2 == 0x9876543210fedcba) && (uVar2 = u64NegInv(1), uVar2 == 0xffffffffffffffff)
               ) && (uVar2 = u64NegInv(5), uVar2 == 0x3333333333333333)) &&
             (uVar2 = u64NegInv(0x3333333333333333), uVar2 == 5)) {
            u64To(dest,(size_t)in_stack_ffffffffffffffb8,(u64 *)0x107739);
            u64From(dest,in_stack_ffffffffffffffb8,0x10774d);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t u64Test()
{
#ifdef U64_SUPPORT
	u64 w = 0x0102030405060708;
	u64 a[2] = {0x0102030405060708, 0x0807060504030201};
	octet b[16];
	// rot
	if (u64RotHi(w, 1) != 0x020406080A0C0E10 ||
		u64RotHi(w, 4) != 0x1020304050607080 ||
		u64RotHi(w, 8) != 0x0203040506070801 ||
		u64RotLo(u64RotHi(w, 7), 7) != w ||
		u64RotLo(u64RotHi(w, 19), 19) != w ||
		u64RotLo(u64RotHi(w, 43), 43) != w)
		return FALSE;
	// reverse
	if (u64Rev(w) != a[1] || u64Rev(a[1]) != w)
		return FALSE;
	u64Rev2(a, 2), u64Rev2(a, 2);
	if (a[0] != w || a[1] != u64Rev(w))
		return FALSE;
	// bit reverse
	if (u64Bitrev(w) != 0x10E060A020C04080 || u64Bitrev(u64Bitrev(w)) != w)
		return FALSE;
	// weight / parity
	if (u64Weight(0) != 0 || u64Parity(0) || !u64Parity(1) ||
		u64Weight(0xA001) != 3 || !u64Parity(0xA001) ||
		u64Weight(0xFFFF) != 16 || u64Parity(0xFFFF) ||
		u64Weight(0xF000A001) != 7 || !u64Parity(0xF000A001) ||
		u64Weight(0x0E00A001) != 6 || u64Parity(0x0E00A001) ||
		u64Weight(0xFFFFFFFF) != 32 || u64Parity(0xFFFFFFFF) ||
		u64Weight(0xAA0180EEF000A001) != 19 ||
		!u64Parity(0xAA0180EEF000A001) ||
		u64Weight(0x730085060E00A001) != 16 ||
		u64Parity(0x730085060E00A001) ||
		u64Weight(0xFFFFFFFFFFFFFFFF) != 64 ||
		u64Parity(0xFFFFFFFFFFFFFFFF))
		return FALSE;
	// CTZ / CLZ
	if (SAFE(u64CTZ)(0) != 64 || FAST(u64CTZ)(0) != 64 ||
		SAFE(u64CLZ)(0) != 64 || FAST(u64CLZ)(0) != 64 ||
		SAFE(u64CTZ)(1) != 0 || FAST(u64CTZ)(1) != 0 ||
		SAFE(u64CLZ)(1) != 63 || FAST(u64CLZ)(1) != 63 ||
		SAFE(u64CTZ)(0xFFF8) != 3 || FAST(u64CTZ)(0xFFF8) != 3 ||
		SAFE(u64CLZ)(0xFFF8) != 48 || FAST(u64CLZ)(0xFFF8) != 48 ||
		SAFE(u64CTZ)(0x7FFFE000) != 13 || FAST(u64CTZ)(0x7FFFE000) != 13 ||
		SAFE(u64CLZ)(0x7FFFE000) != 33 || FAST(u64CLZ)(0x7FFFE000) != 33 ||
		SAFE(u64CTZ)(0x0000003FFDDF8000) != 15 ||
		FAST(u64CTZ)(0x0000003FFDDF8000) != 15 ||
		SAFE(u64CLZ)(0x0000003FFDDF8000) != 26 ||
		FAST(u64CLZ)(0x0000003FFDDF8000) != 26)
		return FALSE;
	// shuffle
	if (u64Deshuffle(0) != 0 || u64Deshuffle(1) != 1 ||
		u64Deshuffle(2) != 0x0000000100000000 ||
		u64Deshuffle(0xAAAAAAAAAAAAAAAA) != 0xFFFFFFFF00000000 ||
		u64Shuffle(u64Deshuffle(0xFEDCBA9876543210)) != 0xFEDCBA9876543210 ||
		u64Deshuffle(u64Shuffle(0x9876543210FEDCBA)) != 0x9876543210FEDCBA)
		return FALSE;
	// negInv
	if (u64NegInv(1) != U64_MAX ||
		u64NegInv(5) != 3689348814741910323 || 
		u64NegInv(3689348814741910323) != 5)
		return FALSE;
	// from / to
	u64To(b, 15, a), u64From(a, b, 15);
	if (a[0] != w || a[1] != 0x0007060504030201)
		return FALSE;
	// shuffle (константы crypto/bash-f)
	w = 0x3BF5080AC8BA94B1;
	w = u64Deshuffle(w);
	if ((u32)w != 0x5F008465 || (u32)(w >> 32) != 0x7C23AF8C)
		return FALSE;
#endif
	// все нормально
	return TRUE;
}